

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedReadsDatastore.cc
# Opt level: O3

ostream * operator<<(ostream *os,LinkedReadsDatastore *lrds)

{
  size_type sVar1;
  pointer pcVar2;
  ostream *poVar3;
  long *local_38;
  long local_30;
  long local_28 [2];
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"Linked Reads Datastore ",0x17);
  sVar1 = (lrds->name)._M_string_length;
  local_38 = local_28;
  if (sVar1 == 0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"unnamed","");
  }
  else {
    pcVar2 = (lrds->name)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>((string *)&local_38,pcVar2,pcVar2 + sVar1);
  }
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_38,local_30);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,": ",2);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," reads",6);
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const LinkedReadsDatastore &lrds) {
    os <<"Linked Reads Datastore "<< (lrds.name.empty() ? "unnamed":lrds.name) <<": "<<lrds.size()<<" reads";
    return os;
}